

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void handle_parent_message(sockaddr_in addr_from)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  uchar auVar4 [8];
  size_type sVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  ulong __n;
  Ip_Port ip_port;
  char str_addr [1000];
  key_type local_430;
  sockaddr_in local_428;
  char local_418 [1008];
  
  uVar1 = *(uint *)((long)buf + 8);
  __n = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  strncpy(local_418,(char *)((long)buf + 0xc),__n);
  uVar3 = addr_from._0_8_;
  auVar4 = addr_from.sin_zero;
  if (local_418[0] != '0') {
    local_418[__n] = '\0';
    parse_address(local_418,&local_428);
    uVar3 = local_428._0_8_;
    auVar4 = local_428.sin_zero;
  }
  local_428.sin_zero = auVar4;
  local_428._0_8_ = uVar3;
  local_430.first = local_428.sin_addr.s_addr;
  local_430.second = local_428.sin_port;
  sVar5 = std::
          map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
          ::count(&idconnections,&local_430);
  iVar2 = global_map_id;
  if (sVar5 == 0) {
    pmVar6 = std::
             map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
             ::operator[](&idconnections,&local_430);
    *pmVar6 = iVar2;
    pmVar7 = std::
             map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
             ::operator[](&connections,&global_map_id);
    pmVar7->sin_family = local_428.sin_family;
    pmVar7->sin_port = local_428.sin_port;
    pmVar7->sin_addr = (in_addr)local_428.sin_addr.s_addr;
    *&pmVar7->sin_zero = local_428.sin_zero;
    global_map_id = global_map_id + 1;
  }
  pmVar6 = std::
           map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
           ::operator[](&idconnections,&local_430);
  id_parent = *pmVar6;
  return;
}

Assistant:

void handle_parent_message(struct sockaddr_in addr_from) {
    size_t size_addr = ntohl(((uint32_t*)buf)[2]);
    char str_addr[ADDRESS_MAX_SIZE];
    strncpy(str_addr, (char*)buf + 3 * sizeof(int), size_addr);

    struct sockaddr_in addr;
    if (str_addr[0] == '0') {
        addr = addr_from;
    }
    else {
        str_addr[size_addr] = '\0';
        parse_address(str_addr, addr);
    }

    Ip_Port ip_port = get_ip_port(addr);
    if (!idconnections.count(ip_port)) {
        idconnections[ip_port] = global_map_id;
        connections[global_map_id] = addr;
        ++global_map_id;
    }

    id_parent = idconnections[ip_port];
}